

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::show_losses(Graph *this,double powerLoss,double minTension,int idLoad)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  reference pvVar4;
  double loss_cost;
  double effective_loss;
  int i;
  double total_time;
  int idLoad_local;
  double minTension_local;
  double powerLoss_local;
  Graph *this_local;
  
  if (idLoad == -1) {
    for (effective_loss._4_4_ = 0; effective_loss._4_4_ < 3;
        effective_loss._4_4_ = effective_loss._4_4_ + 1) {
      std::vector<LoadLevel,_std::allocator<LoadLevel>_>::operator[]
                (&this->loads,(long)effective_loss._4_4_);
    }
    pdVar3 = getTotalLoss(this);
    printf(" Total \t\t|  %9.6f \t| \t%9.2f US$ \t|\t  -  \n",powerLoss,pdVar3[1]);
  }
  else {
    pvVar4 = std::vector<LoadLevel,_std::allocator<LoadLevel>_>::operator[]
                       (&this->loads,(long)idLoad);
    iVar2 = pvVar4->time;
    pvVar4 = std::vector<LoadLevel,_std::allocator<LoadLevel>_>::operator[]
                       (&this->loads,(long)idLoad);
    dVar1 = pvVar4->cost;
    pvVar4 = std::vector<LoadLevel,_std::allocator<LoadLevel>_>::operator[]
                       (&this->loads,(long)idLoad);
    printf(" %1.2f \t\t|  %9.6f \t| \t%9.2f US$ \t|\t %.6f \n",pvVar4->level,powerLoss,
           powerLoss * (double)iVar2 * dVar1,minTension);
  }
  printf("--------------------------------------------------------------------\n");
  return;
}

Assistant:

void Graph::show_losses( double powerLoss, double minTension, int idLoad ){

    if(idLoad == -1) {
        double total_time = 0.0;
        for(int i = 0; i < 3; i++)
            total_time += this->loads[i].time;
        printf(" Total \t\t|  %9.6f \t| \t%9.2f US$ \t|\t  -  \n", powerLoss, this->getTotalLoss()[1]  );
    }
    else {
        double effective_loss = powerLoss * this->loads[idLoad].time;
        double loss_cost = effective_loss * this->loads[idLoad].cost;
        printf(" %1.2f \t\t|  %9.6f \t| \t%9.2f US$ \t|\t %.6f \n", this->loads[idLoad].level, powerLoss, loss_cost, minTension);
    }
    printf("--------------------------------------------------------------------\n");
}